

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

Constant * __thiscall
soul::PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context_const&,soul::Value>
          (PoolAllocator *this,Context *args,Value *args_1)

{
  Value *c;
  Context *this_00;
  DestructorFn *pDVar1;
  _lambda_void___1_ local_7d [13];
  Value local_70;
  Constant *local_30;
  Constant *newObject;
  PoolItem *newItem;
  Value *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_1;
  args_local_1 = (Value *)args;
  args_local = (Context *)this;
  newObject = (Constant *)allocateSpaceForObject(this,0x70);
  c = args_local_1;
  this_00 = &(newObject->super_Expression).super_Statement.super_ASTObject.context;
  soul::Value::Value(&local_70,(Value *)newItem);
  AST::Constant::Constant((Constant *)this_00,(Context *)c,&local_70);
  soul::Value::~Value(&local_70);
  local_30 = (Constant *)this_00;
  pDVar1 = allocate(soul::AST::Context_const&,soul::Value&&)::{lambda(void*)#1}::
           operator_cast_to_function_pointer(local_7d);
  *(DestructorFn **)&(newObject->super_Expression).super_Statement.super_ASTObject.objectType =
       pDVar1;
  return local_30;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }